

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_leb.c
# Opt level: O3

int dwarf_encode_signed_leb128(Dwarf_Signed value,int *nbytes,char *space,int splen)

{
  int iVar1;
  char *str;
  byte *pbVar2;
  Dwarf_Signed DVar3;
  
  if (0 < splen) {
    pbVar2 = (byte *)(space + splen);
    iVar1 = 1;
    DVar3 = value;
    do {
      if ((DVar3 >> 7 == value >> 0x3f) && ((((uint)DVar3 ^ (uint)(value >> 0x3f)) & 0x40) == 0)) {
        *space = (byte)DVar3 & 0x7f;
        *nbytes = iVar1;
        return 0;
      }
      *space = (byte)DVar3 | 0x80;
      space = (char *)((byte *)space + 1);
      iVar1 = iVar1 + 1;
      DVar3 = DVar3 >> 7;
    } while (space < pbVar2);
  }
  return 1;
}

Assistant:

int dwarf_encode_signed_leb128(Dwarf_Signed value, int *nbytes,
    char *space, int splen)
{
    char *str;
    Dwarf_Signed sign = -(value < 0);
    int more = 1;
    char *end = space + splen;

    str = space;

    do {
        unsigned char byte = value & DATA_MASK;

        value >>= DIGIT_WIDTH;

        if (str >= end) {
            return DW_DLV_ERROR;
        }
        /*  Remaining chunks would just contain the sign
            bit, and this chunk
            has already captured at least one sign bit.  */
        if (value == sign &&
            ((byte & SIGN_BIT) == (sign & SIGN_BIT))) {
            more = 0;
        } else {
            byte |= MORE_BYTES;
        }
        *str = byte;
        str++;
    } while (more);
    *nbytes = (int)(str - space);
    return DW_DLV_OK;
}